

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.hpp
# Opt level: O2

error_info *
toml::detail::make_type_error<toml::type_config>
          (error_info *__return_storage_ptr__,basic_value<toml::type_config> *v,string *fname,
          value_t ty)

{
  undefined7 in_register_00000009;
  value_t t;
  value_t t_00;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  source_location local_90;
  
  std::operator+(&local_d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)fname,
                 ": bad_cast to ");
  to_string_abi_cxx11_(&local_f0,(toml *)(CONCAT71(in_register_00000009,ty) & 0xffffffff),t);
  std::operator+(&local_b0,&local_d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f0);
  source_location::source_location(&local_90,&v->region_);
  to_string_abi_cxx11_(&local_130,(toml *)(ulong)v->type_,t_00);
  std::operator+(&local_110,"the actual type is ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_130);
  make_error_info<>(__return_storage_ptr__,(string *)&local_b0,&local_90,(string *)&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_130);
  source_location::~source_location(&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_d0);
  return __return_storage_ptr__;
}

Assistant:

error_info make_type_error(const basic_value<TC>& v, const std::string& fname, const value_t ty)
{
    return make_error_info(fname + ": bad_cast to " + to_string(ty),
        v.location(), "the actual type is " + to_string(v.type()));
}